

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_heap.h
# Opt level: O2

void __thiscall merlin::indexed_heap::max_heapify(indexed_heap *this,size_t i)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i_00;
  
  while( true ) {
    uVar2 = i * 2;
    pdVar1 = (this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (long)(this->m_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
    i_00 = i;
    if ((uVar2 <= uVar3) &&
       (pdVar1[i - 1] <= pdVar1[i * 2 + -1] && pdVar1[i * 2 + -1] != pdVar1[i - 1])) {
      i_00 = uVar2;
    }
    if ((uVar2 < uVar3) && (pdVar1[i_00 - 1] <= pdVar1[i * 2] && pdVar1[i * 2] != pdVar1[i_00 - 1]))
    {
      i_00 = i * 2 + 1;
    }
    if (i_00 == i) break;
    heap_swap(this,i_00,i);
    i = i_00;
  }
  return;
}

Assistant:

void max_heapify(size_t i) {
		for (;;) {
			size_t left = 2 * i, right = 2 * i + 1, largest = i;
			if (left <= m_p.size() && m_p[left - 1] > m_p[largest - 1])
				largest = left;
			if (right <= m_p.size() && m_p[right - 1] > m_p[largest - 1])
				largest = right;
			if (largest == i)
				return;
			heap_swap(largest, i);
			i = largest;
		}
	}